

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bson-iter.c
# Opt level: O1

void bson_iter_binary(bson_iter_t *iter,bson_subtype_t *subtype,uint32_t *binary_len,
                     uint8_t **binary)

{
  size_t *psVar1;
  long *plVar2;
  uint8_t uVar3;
  byte bVar4;
  size_t sVar5;
  ulong uVar6;
  double dVar7;
  int64_t iVar8;
  _Bool _Var9;
  char cVar10;
  bson_subtype_t bVar11;
  int iVar12;
  void *pvVar13;
  undefined8 uVar14;
  size_t sVar15;
  char *pcVar16;
  code *pcVar17;
  bson_oid_t *pbVar18;
  char *__s;
  size_t nbytes;
  ulong uVar19;
  uint32_t uVar20;
  uint8_t *puVar21;
  uint8_t *puVar22;
  ulong uVar23;
  int iVar24;
  int32_t iVar25;
  undefined4 *extraout_RDX;
  long *extraout_RDX_00;
  undefined4 *extraout_RDX_01;
  undefined8 extraout_RDX_02;
  bson_error_t *error;
  size_t __n;
  bson_json_destroy_cb p_Var26;
  anon_union_24_17_78d57918_for_value *dst;
  long lVar27;
  bson_json_reader_cb num_bytes;
  bson_error_t *__s_00;
  bson_t *pbVar28;
  uint uVar29;
  undefined4 extraout_XMM0_Da;
  undefined4 extraout_XMM0_Db;
  bson_error_t bStack_4e0;
  uint32_t uStack_220;
  _Bool _Stack_219;
  bson_t *pbStack_218;
  uint32_t uStack_210;
  uint32_t uStack_20c;
  uint8_t *puStack_208;
  char *apcStack_200 [33];
  
  if (iter == (bson_iter_t *)0x0) {
    bson_iter_binary_cold_2();
  }
  else if (binary_len != (uint32_t *)0x0 || binary == (uint8_t **)0x0) {
    puVar21 = iter->raw;
    if (puVar21[iter->type] == '\x05') {
      bVar11 = (bson_subtype_t)puVar21[iter->d2];
      if (subtype != (bson_subtype_t *)0x0) {
        *subtype = (uint)puVar21[iter->d2];
      }
      if (binary != (uint8_t **)0x0) {
        uVar20 = *(uint32_t *)(puVar21 + iter->d1);
        *binary_len = uVar20;
        uVar29 = iter->d3;
        puVar21 = iter->raw;
        *binary = puVar21 + uVar29;
        if (subtype != (bson_subtype_t *)0x0) {
          bVar11 = *subtype;
        }
        if (bVar11 == BSON_SUBTYPE_BINARY_DEPRECATED) {
          *binary_len = uVar20 - 4;
          *binary = puVar21 + uVar29 + 4;
        }
      }
    }
    else {
      if (binary != (uint8_t **)0x0) {
        *binary = (uint8_t *)0x0;
      }
      if (binary_len != (uint32_t *)0x0) {
        *binary_len = 0;
      }
      if (subtype != (bson_subtype_t *)0x0) {
        *subtype = BSON_SUBTYPE_BINARY;
      }
    }
    return;
  }
  bson_iter_binary_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\b') {
      return;
    }
    return;
  }
  bson_iter_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    uVar3 = *(uint8_t *)
             ((long)(((bson_json_reader_t *)iter)->producer).data +
             (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb);
    switch(uVar3) {
    case '\x01':
      return;
    case '\x02':
    case '\x03':
    case '\x04':
    case '\x05':
    case '\a':
    case '\t':
      break;
    case '\x06':
    case '\n':
      break;
    case '\b':
      return;
    default:
      if (uVar3 == '\x10') {
        return;
      }
      if (uVar3 == '\x12') {
        return;
      }
    }
    return;
  }
  bson_iter_as_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return;
  }
  bson_iter_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\x12') {
      return;
    }
    return;
  }
  bson_iter_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    return;
  }
  bson_iter_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    bVar4 = puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb];
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return;
      }
      if ((bVar4 == 8) && (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] != '\0'))
      {
        return;
      }
    }
    else if ((bVar4 != 0x10) && (bVar4 == 0x12)) {
      return;
    }
    return;
  }
  bson_iter_as_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    bVar4 = *(byte *)((long)(((bson_json_reader_t *)iter)->producer).data +
                     (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb);
    if (bVar4 < 0x10) {
      if (bVar4 == 1) {
        return;
      }
      if (bVar4 == 8) {
        return;
      }
    }
    else if ((bVar4 != 0x10) && (bVar4 == 0x12)) {
      return;
    }
    return;
  }
  bson_iter_as_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      plVar2 = (long *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar14 = *plVar2;
      lVar27 = plVar2[1];
      ((bson_t *)subtype)->flags = (int)uVar14;
      ((bson_t *)subtype)->len = (int)((ulong)uVar14 >> 0x20);
      *(long *)((bson_t *)subtype)->padding = lVar27;
    }
    return;
  }
  bson_iter_decimal128_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\a') {
      return;
    }
    return;
  }
  bson_iter_oid_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\v') {
      puVar21 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      puVar21 = (uint8_t *)0x0;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      *(uint8_t **)subtype = puVar21;
    }
    return;
  }
  bson_iter_regex_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        iVar12 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        iVar24 = 1;
        if (1 < iVar12) {
          iVar24 = iVar12;
        }
        ((bson_t *)subtype)->flags = iVar24 - 1;
      }
      return;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = 0;
    }
    return;
  }
  bson_iter_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x02') {
      iVar12 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar12 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar29 = iVar12 - 1;
      puVar21 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
    }
    else {
      uVar29 = 0;
      puVar21 = (uint8_t *)0x0;
    }
    if (puVar21 != (uint8_t *)0x0) {
      pvVar13 = bson_malloc0((ulong)(uVar29 + 1));
      memcpy(pvVar13,puVar21,(ulong)uVar29);
      *(undefined1 *)((long)pvVar13 + (ulong)uVar29) = 0;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = uVar29;
    }
    return;
  }
  bson_iter_dup_utf8_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\r') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        iVar12 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        iVar24 = 1;
        if (1 < iVar12) {
          iVar24 = iVar12;
        }
        ((bson_t *)subtype)->flags = iVar24 - 1;
      }
      return;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = 0;
    }
    return;
  }
  bson_iter_code_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_codewscope_cold_2();
  }
  else {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] != '\x0f') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        ((bson_t *)subtype)->flags = 0;
      }
      if (extraout_RDX != (undefined4 *)0x0) {
        *extraout_RDX = 0;
      }
      if (binary == (uint8_t **)0x0) {
        return;
      }
      *binary = (uint8_t *)0x0;
      return;
    }
    if ((bson_t *)subtype == (bson_t *)0x0) {
LAB_001113bb:
      *extraout_RDX =
           *(undefined4 *)
            (puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4));
      *binary = puVar21 + *(uint32_t *)
                           ((long)&(((bson_json_reader_t *)iter)->producer).buf_size + 4);
      return;
    }
    if (*(int *)(puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4))
        != 0) {
      ((bson_t *)subtype)->flags =
           *(int *)(puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4)
                   ) - 1;
      goto LAB_001113bb;
    }
  }
  bson_iter_codewscope_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (extraout_RDX_00 != (long *)0x0) {
      *extraout_RDX_00 = 0;
    }
    if (binary != (uint8_t **)0x0) {
      *binary = (uint8_t *)0x0;
    }
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\f') {
      if ((bson_t *)subtype != (bson_t *)0x0) {
        uVar20 = *(uint32_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
        ((bson_t *)subtype)->flags = uVar20;
        if (uVar20 != 0) {
          ((bson_t *)subtype)->flags = uVar20 - 1;
        }
      }
      if (extraout_RDX_00 != (long *)0x0) {
        *extraout_RDX_00 =
             (long)((long)(((bson_json_reader_t *)iter)->producer).data +
                   (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4));
      }
      if (binary != (uint8_t **)0x0) {
        *binary = (uint8_t *)
                  ((long)(((bson_json_reader_t *)iter)->producer).data +
                  (ulong)(uint)(((bson_json_reader_t *)iter)->producer).buf_size);
      }
    }
    return;
  }
  bson_iter_dbpointer_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x0e') {
      iVar12 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar24 = 1;
      if (1 < iVar12) {
        iVar24 = iVar12;
      }
      uVar20 = iVar24 - 1;
    }
    else {
      uVar20 = 0;
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = uVar20;
    }
    return;
  }
  bson_iter_symbol_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return;
    }
    return;
  }
  bson_iter_date_time_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    if (*(uint8_t *)
         ((long)(((bson_json_reader_t *)iter)->producer).data +
         (ulong)*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb) == '\t') {
      return;
    }
    return;
  }
  bson_iter_time_t_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    uVar20 = 0;
    uVar14 = 0;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x11') {
      uVar14 = *(undefined8 *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      uVar20 = (uint32_t)((ulong)uVar14 >> 0x20);
    }
    if ((bson_t *)subtype != (bson_t *)0x0) {
      ((bson_t *)subtype)->flags = uVar20;
    }
    if (extraout_RDX_01 != (undefined4 *)0x0) {
      *extraout_RDX_01 = (int)uVar14;
    }
    return;
  }
  bson_iter_timestamp_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\t') {
      lVar27 = *(long *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(long *)subtype = lVar27 / 1000;
      *(long *)((bson_t *)subtype)->padding = (lVar27 % 1000) * 1000;
      return;
    }
    ((bson_t *)subtype)->flags = 0;
    ((bson_t *)subtype)->len = 0;
    ((bson_t *)subtype)->padding[0] = '\0';
    ((bson_t *)subtype)->padding[1] = '\0';
    ((bson_t *)subtype)->padding[2] = '\0';
    ((bson_t *)subtype)->padding[3] = '\0';
    ((bson_t *)subtype)->padding[4] = '\0';
    ((bson_t *)subtype)->padding[5] = '\0';
    ((bson_t *)subtype)->padding[6] = '\0';
    ((bson_t *)subtype)->padding[7] = '\0';
    return;
  }
  bson_iter_timeval_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_visit_all_cold_2();
  }
  else if ((bson_t *)subtype != (bson_t *)0x0) {
    _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
    if (_Var9) {
      do {
        puVar21 = puStack_208;
        if (*puStack_208 != '\0') {
          sVar15 = strlen((char *)puStack_208);
          _Var9 = bson_utf8_validate((char *)puVar21,sVar15,false);
          if (!_Var9) {
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            break;
          }
        }
        if ((*(code **)subtype != (code *)0x0) &&
           (cVar10 = (**(code **)subtype)(iter,puVar21,extraout_RDX_02), cVar10 != '\0')) {
          return;
        }
        switch(uStack_210) {
        case 1:
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x10);
          if (pcVar17 == (code *)0x0) break;
          dVar7 = bson_iter_double(iter);
          cVar10 = (*pcVar17)(SUB84(dVar7,0),iter,puVar21,extraout_RDX_02);
          goto LAB_00111ad6;
        case 2:
          pcVar16 = bson_iter_utf8(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar16,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var9) {
LAB_00111b8c:
            *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) =
                 *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).cb + 4);
            return;
          }
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x18);
          goto LAB_001119f8;
        case 3:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_document(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var9) {
            pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x20);
            goto LAB_00111a42;
          }
          break;
        case 4:
          pbStack_218 = (bson_t *)0x0;
          uStack_220 = 0;
          bson_iter_array(iter,&uStack_220,(uint8_t **)&pbStack_218);
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_220);
          if (_Var9) {
            pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x28);
            goto LAB_00111a42;
          }
          break;
        case 5:
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)((ulong)pbStack_218 & 0xffffffff00000000);
          uStack_220 = 0;
          bson_iter_binary(iter,(bson_subtype_t *)&pbStack_218,&uStack_220,(uint8_t **)apcStack_200)
          ;
          if (*(code **)(((bson_t *)subtype)->padding + 0x30) != (code *)0x0) {
            cVar10 = (**(code **)(((bson_t *)subtype)->padding + 0x30))
                               (iter,puVar21,(ulong)pbStack_218 & 0xffffffff,uStack_220,
                                apcStack_200[0],extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 6:
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x38);
          goto LAB_001119ae;
        case 7:
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x40);
          if (pcVar17 != (code *)0x0) {
            pbVar18 = bson_iter_oid(iter);
LAB_00111ac7:
            cVar10 = (*pcVar17)(iter,puVar21,pbVar18,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 8:
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x48);
          if (pcVar17 != (code *)0x0) {
            _Var9 = bson_iter_bool(iter);
            uVar29 = (uint)_Var9;
LAB_00111934:
            cVar10 = (*pcVar17)(iter,puVar21,uVar29,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 9:
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x50);
          if (pcVar17 != (code *)0x0) {
            pbVar18 = (bson_oid_t *)bson_iter_date_time(iter);
            goto LAB_00111ac7;
          }
          break;
        case 10:
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x58);
LAB_001119ae:
          if (pcVar17 == (code *)0x0) break;
LAB_001119bd:
          cVar10 = (*pcVar17)(iter,puVar21,extraout_RDX_02);
          goto LAB_00111ad6;
        case 0xb:
          apcStack_200[0] = (char *)0x0;
          __s = bson_iter_regex(iter,apcStack_200);
          sVar15 = strlen(__s);
          _Var9 = bson_utf8_validate(__s,sVar15,true);
          if (!_Var9) goto LAB_00111b8c;
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x60);
          pcVar16 = apcStack_200[0];
          if (pcVar17 == (code *)0x0) break;
          goto LAB_00111aaf;
        case 0xc:
          uStack_220 = 0;
          apcStack_200[0] = (char *)0x0;
          pbStack_218 = (bson_t *)0x0;
          bson_iter_dbpointer(iter,&uStack_220,apcStack_200,(bson_oid_t **)&pbStack_218);
          _Var9 = bson_utf8_validate(apcStack_200[0],(ulong)uStack_220,true);
          if (!_Var9) goto LAB_00111b8c;
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x68);
          pcVar16 = apcStack_200[0];
          pbVar28 = pbStack_218;
          if (pcVar17 != (code *)0x0) {
LAB_001117cc:
            cVar10 = (*pcVar17)(iter,puVar21,uStack_220,pcVar16,pbVar28,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 0xd:
          pcVar16 = bson_iter_code(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar16,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var9) goto LAB_00111b8c;
          pcVar17 = *(code **)(((bson_t *)subtype)->padding + 0x70);
          goto LAB_001119f8;
        case 0xe:
          pcVar16 = bson_iter_symbol(iter,(uint32_t *)apcStack_200);
          _Var9 = bson_utf8_validate(pcVar16,(ulong)apcStack_200[0] & 0xffffffff,true);
          if (!_Var9) goto LAB_00111b8c;
          pcVar17 = *(code **)((long)subtype + 0x80);
LAB_001119f8:
          if (pcVar17 != (code *)0x0) {
            __s = (char *)((ulong)apcStack_200[0] & 0xffffffff);
LAB_00111aaf:
            cVar10 = (*pcVar17)(iter,puVar21,__s,pcVar16,extraout_RDX_02);
LAB_00111ad6:
            if (cVar10 != '\0') {
              return;
            }
          }
          break;
        case 0xf:
          uStack_220 = 0;
          pbStack_218 = (bson_t *)0x0;
          uStack_20c = 0;
          pcVar16 = bson_iter_codewscope(iter,&uStack_220,&uStack_20c,(uint8_t **)&pbStack_218);
          _Var9 = bson_utf8_validate(pcVar16,(ulong)uStack_220,true);
          if (!_Var9) goto LAB_00111b8c;
          _Var9 = bson_init_static((bson_t *)apcStack_200,(uint8_t *)pbStack_218,(ulong)uStack_20c);
          if ((_Var9) &&
             (pcVar17 = *(code **)((bson_t *)((long)subtype + 0x80))->padding,
             pcVar17 != (code *)0x0)) {
            pbVar28 = (bson_t *)apcStack_200;
            goto LAB_001117cc;
          }
          break;
        case 0x10:
          pcVar17 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 8);
          if (pcVar17 != (code *)0x0) {
            uVar29 = bson_iter_int32(iter);
            goto LAB_00111934;
          }
          break;
        case 0x11:
          bson_iter_timestamp(iter,(uint32_t *)apcStack_200,(uint32_t *)&pbStack_218);
          if (*(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x10) != (code *)0x0) {
            cVar10 = (**(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x10))
                               (iter,puVar21,(ulong)apcStack_200[0] & 0xffffffff,
                                (ulong)pbStack_218 & 0xffffffff,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        case 0x12:
          pcVar17 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x18);
          if (pcVar17 != (code *)0x0) {
            pbVar18 = (bson_oid_t *)bson_iter_int64(iter);
            goto LAB_00111ac7;
          }
          break;
        case 0x13:
          bson_iter_decimal128(iter,(bson_decimal128_t *)apcStack_200);
          pcVar17 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x38);
LAB_00111a42:
          if (pcVar17 != (code *)0x0) {
            cVar10 = (*pcVar17)(iter,puVar21,(bson_t *)apcStack_200,extraout_RDX_02);
            goto LAB_00111ad6;
          }
          break;
        default:
          if (uStack_210 == 0x7f) {
            pcVar17 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x20);
          }
          else {
            if (uStack_210 != 0xff) break;
            pcVar17 = *(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x28);
          }
          if (pcVar17 == (code *)0x0) break;
          puVar21 = (uint8_t *)
                    ((long)(((bson_json_reader_t *)iter)->producer).data +
                    (ulong)*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).dcb + 4));
          goto LAB_001119bd;
        }
        if ((*(code **)((bson_t *)subtype)->padding != (code *)0x0) &&
           (cVar10 = (**(code **)((bson_t *)subtype)->padding)
                               (iter,(uint8_t *)
                                     ((long)(((bson_json_reader_t *)iter)->producer).data +
                                     (ulong)*(uint32_t *)
                                             ((long)&(((bson_json_reader_t *)iter)->producer).dcb +
                                             4)),extraout_RDX_02), cVar10 != '\0')) {
          return;
        }
        _Var9 = _bson_iter_next_internal(iter,(char **)&puStack_208,&uStack_210,&_Stack_219);
      } while (_Var9);
    }
    if (*(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).bytes_read + 4) != 0) {
      if ((_Stack_219 == true) &&
         (*(long *)(((bson_t *)((long)subtype + 0x80))->padding + 0x30) != 0)) {
        sVar15 = strlen((char *)puStack_208);
        _Var9 = bson_utf8_validate((char *)puStack_208,sVar15,false);
        if (_Var9) {
          (**(code **)(((bson_t *)((long)subtype + 0x80))->padding + 0x30))
                    (iter,puStack_208,uStack_210,extraout_RDX_02);
          return;
        }
      }
      if (*(code **)(((bson_t *)subtype)->padding + 8) != (code *)0x0) {
        (**(code **)(((bson_t *)subtype)->padding + 8))(iter,extraout_RDX_02);
      }
    }
    return;
  }
  bson_iter_visit_all_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\b') {
      puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).buf] = (uint8_t)subtype;
    }
    return;
  }
  bson_iter_overwrite_bool_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x10') {
      *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) = (int)subtype;
    }
    return;
  }
  bson_iter_overwrite_int32_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x12') {
      *(bson_subtype_t **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           subtype;
    }
    return;
  }
  bson_iter_overwrite_int64_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x01') {
      *(ulong *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) =
           CONCAT44(extraout_XMM0_Db,extraout_XMM0_Da);
    }
    return;
  }
  bson_iter_overwrite_double_cold_1();
  if ((bson_json_reader_t *)iter != (bson_json_reader_t *)0x0) {
    puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
    if (puVar21[*(uint *)&(((bson_json_reader_t *)iter)->producer).dcb] == '\x13') {
      lVar27 = *(long *)((bson_t *)subtype)->padding;
      plVar2 = (long *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *plVar2 = *(undefined8 *)subtype;
      plVar2[1] = lVar27;
    }
    return;
  }
  bson_iter_overwrite_decimal128_cold_1();
  if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
    bson_iter_value_cold_1();
    if ((bson_json_reader_t *)iter == (bson_json_reader_t *)0x0) {
      bson_json_reader_read_cold_2();
    }
    else if ((bson_t *)subtype != (bson_t *)0x0) {
      (((bson_json_reader_t *)iter)->bson).bson = (bson_t *)subtype;
      (((bson_json_reader_t *)iter)->bson).n = -1;
      (((bson_json_reader_t *)iter)->bson).read_state = BSON_JSON_REGULAR;
      __s_00 = &bStack_4e0;
      if (error != (bson_error_t *)0x0) {
        __s_00 = error;
      }
      ((bson_json_reader_t *)iter)->error = __s_00;
      memset(__s_00,0,0x200);
      iVar12 = 0;
      while( true ) {
        sVar5 = ((bson_json_reader_t *)iter)->json->pos;
        nbytes = (((bson_json_reader_t *)iter)->producer).bytes_read;
        if (nbytes == 0) {
          nbytes = (*(((bson_json_reader_t *)iter)->producer).cb)
                             ((((bson_json_reader_t *)iter)->producer).data,
                              (((bson_json_reader_t *)iter)->producer).buf,
                              (((bson_json_reader_t *)iter)->producer).buf_size);
        }
        if ((long)nbytes < 0) {
          iVar12 = -1;
          if (error != (bson_error_t *)0x0) {
            bson_set_error(error,1,3,"reader cb failed");
          }
          goto LAB_00111fff;
        }
        if (nbytes == 0) goto LAB_00111fff;
        (((bson_json_reader_t *)iter)->producer).bytes_read = nbytes;
        jsonsl_feed(((bson_json_reader_t *)iter)->json,
                    (jsonsl_char_t *)(((bson_json_reader_t *)iter)->producer).buf,nbytes);
        if (((bson_json_reader_t *)iter)->should_reset == true) {
          jsonsl_reset(((bson_json_reader_t *)iter)->json);
          ((bson_json_reader_t *)iter)->should_reset = false;
          puVar21 = (((bson_json_reader_t *)iter)->producer).buf;
          memmove(puVar21,puVar21 + ((bson_json_reader_t *)iter)->advance,
                  nbytes - ((bson_json_reader_t *)iter)->advance);
          psVar1 = &(((bson_json_reader_t *)iter)->producer).bytes_read;
          *psVar1 = *psVar1 - ((bson_json_reader_t *)iter)->advance;
          iVar12 = 1;
          goto LAB_00111fff;
        }
        if (((bson_json_reader_t *)iter)->error->domain != 0) break;
        uVar23 = ((bson_json_reader_t *)iter)->json_text_pos;
        if ((uVar23 != 0xffffffffffffffff) &&
           (uVar6 = ((bson_json_reader_t *)iter)->json->pos, uVar19 = uVar6 - uVar23,
           uVar23 <= uVar6 && uVar19 != 0)) {
          if (uVar19 < nbytes) {
            nbytes = uVar19;
          }
          lVar27 = uVar23 - sVar5;
          if (lVar27 < 1) {
            lVar27 = 0;
          }
          _bson_json_buf_append
                    (&((bson_json_reader_t *)iter)->tok_accumulator,
                     (((bson_json_reader_t *)iter)->producer).buf + lVar27,nbytes);
        }
        (((bson_json_reader_t *)iter)->producer).bytes_read = 0;
        iVar12 = 1;
      }
      iVar12 = -1;
LAB_00111fff:
      if ((iVar12 == 1) && ((((bson_json_reader_t *)iter)->bson).read_state != BSON_JSON_DONE)) {
        _bson_json_read_corrupt((bson_json_reader_t *)iter,"%s","Incomplete JSON");
      }
      return;
    }
    bson_json_reader_read_cold_1();
    p_Var26 = (((bson_json_reader_t *)iter)->producer).dcb;
    if (p_Var26 == (bson_json_destroy_cb)0x0) {
      _bson_json_buf_ensure((bson_json_buf_t *)iter,__n + 1);
    }
    else if ((((bson_json_reader_t *)iter)->producer).cb < p_Var26 + __n + 1) {
      uVar23 = (ulong)(p_Var26 + __n) >> 1 | (ulong)(p_Var26 + __n);
      uVar23 = uVar23 >> 2 | uVar23;
      uVar23 = uVar23 >> 4 | uVar23;
      uVar23 = uVar23 >> 8 | uVar23;
      uVar23 = uVar23 >> 0x10 | uVar23;
      num_bytes = (bson_json_reader_cb)((uVar23 >> 0x20 | uVar23) + 1);
      (((bson_json_reader_t *)iter)->producer).cb = num_bytes;
      pvVar13 = bson_realloc((((bson_json_reader_t *)iter)->producer).data,(size_t)num_bytes);
      (((bson_json_reader_t *)iter)->producer).data = pvVar13;
    }
    memcpy((((bson_json_reader_t *)iter)->producer).dcb +
           (long)(((bson_json_reader_t *)iter)->producer).data,subtype,__n);
    p_Var26 = (((bson_json_reader_t *)iter)->producer).dcb + __n;
    (((bson_json_reader_t *)iter)->producer).dcb = p_Var26;
    p_Var26[(long)(((bson_json_reader_t *)iter)->producer).data] = (_func_void_void_ptr)0x0;
    return;
  }
  puVar21 = (uint8_t *)(((bson_json_reader_t *)iter)->producer).data;
  uVar29 = *(uint *)&(((bson_json_reader_t *)iter)->producer).dcb;
  bVar4 = puVar21[uVar29];
  ((bson_value_t *)&(((bson_json_reader_t *)iter)->producer).bytes_parsed)->value_type = (uint)bVar4
  ;
  switch(bVar4) {
  case 1:
    dVar7 = bson_iter_double(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_double = dVar7;
    break;
  case 2:
    pcVar16 = bson_iter_utf8(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 3:
    bson_iter_document(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                       (uint8_t **)
                       &((anon_union_24_17_78d57918_for_value *)
                        &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 4:
    bson_iter_array(iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                    (uint8_t **)
                    &((anon_union_24_17_78d57918_for_value *)
                     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 5:
    bson_iter_binary(iter,(bson_subtype_t *)&((bson_json_reader_t *)iter)->field_0x44,
                     (uint32_t *)&((bson_json_reader_t *)iter)->field_0x40,
                     (uint8_t **)
                     &((anon_union_24_17_78d57918_for_value *)
                      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64);
    break;
  case 6:
  case 10:
    break;
  case 7:
    pbVar18 = bson_iter_oid(iter);
    dst = (anon_union_24_17_78d57918_for_value *)
          &(((bson_json_reader_t *)iter)->producer).all_whitespace;
    goto LAB_00111da5;
  case 8:
    _Var9 = bson_iter_bool(iter);
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_bool = _Var9;
    break;
  case 9:
    pcVar16 = (char *)bson_iter_date_time(iter);
    goto LAB_00111e4c;
  case 0xb:
    pcVar16 = bson_iter_regex(iter,(char **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0xc:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = 0;
    pbVar18 = (bson_oid_t *)0x0;
    if (puVar21[uVar29] == '\f') {
      uVar29 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar12 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + -1;
      if (*(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) == 0) {
        iVar12 = 0;
      }
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar12;
      (((anon_union_24_17_78d57918_for_value *)
       &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str =
           (char *)(puVar21 + uVar29);
      pbVar18 = (bson_oid_t *)(puVar21 + (uint)(((bson_json_reader_t *)iter)->producer).buf_size);
    }
    dst = (anon_union_24_17_78d57918_for_value *)&((bson_json_reader_t *)iter)->field_0x44;
LAB_00111da5:
    bson_oid_copy(pbVar18,&dst->v_oid);
    break;
  case 0xd:
    if (puVar21[uVar29] == '\r') {
      iVar12 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar12 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      uVar29 = *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar12 + -1;
      puVar22 = puVar21 + uVar29;
    }
    else {
      *(undefined4 *)&((bson_json_reader_t *)iter)->field_0x40 = 0;
      puVar22 = (uint8_t *)0x0;
    }
    goto LAB_00111e59;
  case 0xe:
    if (puVar21[uVar29] == '\x0e') {
      puVar22 = puVar21 + *(uint32_t *)((long)&(((bson_json_reader_t *)iter)->producer).buf + 4);
      iVar12 = 1;
      if (1 < *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf)) {
        iVar12 = *(int *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      }
      iVar12 = iVar12 + -1;
    }
    else {
      puVar22 = (uint8_t *)0x0;
      iVar12 = 0;
    }
    *(int *)&((bson_json_reader_t *)iter)->field_0x40 = iVar12;
LAB_00111e59:
    (((anon_union_24_17_78d57918_for_value *)
     &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_utf8).str = (char *)puVar22;
    break;
  case 0xf:
    pcVar16 = bson_iter_codewscope
                        (iter,(uint32_t *)&((bson_json_reader_t *)iter)->field_0x48,
                         (uint32_t *)&((bson_json_reader_t *)iter)->field_0x4c,
                         (uint8_t **)&((bson_json_reader_t *)iter)->field_0x40);
    goto LAB_00111e4c;
  case 0x10:
    iVar25 = 0;
    if (puVar21[uVar29] == '\x10') {
      iVar25 = *(int32_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar25;
    break;
  case 0x11:
    iVar25 = 0;
    uVar14 = 0;
    if (puVar21[uVar29] == '\x11') {
      uVar14 = *(undefined8 *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      iVar25 = (int32_t)((ulong)uVar14 >> 0x20);
    }
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int32 = iVar25;
    *(int *)&(((bson_json_reader_t *)iter)->producer).field_0x3c = (int)uVar14;
    break;
  case 0x12:
    if (puVar21[uVar29] == '\x12') {
      pcVar16 = *(char **)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
    }
    else {
      pcVar16 = (char *)0x0;
    }
LAB_00111e4c:
    ((anon_union_24_17_78d57918_for_value *)&(((bson_json_reader_t *)iter)->producer).all_whitespace
    )->v_int64 = (int64_t)pcVar16;
    break;
  case 0x13:
    if (puVar21[uVar29] == '\x13') {
      iVar8 = *(int64_t *)
               ((long)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf) + 8);
      ((anon_union_24_17_78d57918_for_value *)
      &(((bson_json_reader_t *)iter)->producer).all_whitespace)->v_int64 =
           *(int64_t *)(puVar21 + *(uint *)&(((bson_json_reader_t *)iter)->producer).buf);
      *(int64_t *)&((bson_json_reader_t *)iter)->field_0x40 = iVar8;
    }
    break;
  default:
    if ((bVar4 != BSON_TYPE_MAXKEY) && (bVar4 != 0xff)) {
      return;
    }
  }
  return;
}

Assistant:

void
bson_iter_binary (const bson_iter_t *iter, /* IN */
                  bson_subtype_t *subtype, /* OUT */
                  uint32_t *binary_len,    /* OUT */
                  const uint8_t **binary)  /* OUT */
{
   bson_subtype_t backup;

   BSON_ASSERT (iter);
   BSON_ASSERT (!binary || binary_len);

   if (ITER_TYPE (iter) == BSON_TYPE_BINARY) {
      if (!subtype) {
         subtype = &backup;
      }

      *subtype = (bson_subtype_t) * (iter->raw + iter->d2);

      if (binary) {
         memcpy (binary_len, (iter->raw + iter->d1), sizeof (*binary_len));
         *binary_len = BSON_UINT32_FROM_LE (*binary_len);
         *binary = iter->raw + iter->d3;

         if (*subtype == BSON_SUBTYPE_BINARY_DEPRECATED) {
            *binary_len -= sizeof (int32_t);
            *binary += sizeof (int32_t);
         }
      }

      return;
   }

   if (binary) {
      *binary = NULL;
   }

   if (binary_len) {
      *binary_len = 0;
   }

   if (subtype) {
      *subtype = BSON_SUBTYPE_BINARY;
   }
}